

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

void fmt_PrintNumber(char *buf,size_t bufLen,FormatSpec *fmt,uint32_t value)

{
  char cVar1;
  bool bVar2;
  size_t j;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *__format;
  long lVar6;
  int32_t v;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  char cVar10;
  double dVar11;
  char local_14c;
  char valueBuf [262];
  
  uVar8 = fmt->type;
  if (((0x20 < uVar8 - 0x58) || ((0x100800401U >> ((ulong)(uVar8 - 0x58) & 0x3f) & 1) == 0)) &&
     (fmt->prefix == true)) {
    error("Formatting type \'%c\' with prefix flag \'#\'\n");
    uVar8 = fmt->type;
  }
  if (uVar8 == 0x66) {
    cVar10 = (char)fmt->sign;
    uVar8 = 0x66;
LAB_0010a9c6:
    if (0x80000000 < value) {
      value = -value;
      cVar10 = '-';
    }
  }
  else {
    if (fmt->hasFrac == true) {
      error("Formatting type \'%c\' with fractional width\n");
      uVar8 = fmt->type;
    }
    if (uVar8 == 0x73) {
      error("Formatting number as type \'s\'\n");
      uVar8 = fmt->type;
    }
    cVar10 = (char)fmt->sign;
    if ((uVar8 | 2) == 0x66) goto LAB_0010a9c6;
  }
  if (fmt->prefix == true) {
    local_14c = '$';
    if (uVar8 == 0x58) goto LAB_0010aa0a;
    if (uVar8 != 0x62) {
      if ((uVar8 != 0x78) && (local_14c = '&', uVar8 != 0x6f)) {
        local_14c = '\0';
      }
      goto LAB_0010aa0a;
    }
    local_14c = '%';
LAB_0010aa92:
    uVar4 = (ulong)value;
    uVar7 = 0xffffffffffffffff;
    do {
      uVar3 = uVar7;
      valueBuf[uVar3 + 1] = (byte)value & 1 | 0x30;
      uVar4 = uVar4 >> 1;
      uVar7 = uVar3 + 1;
      bVar2 = 1 < value;
      value = (uint)uVar4;
    } while (bVar2);
    valueBuf[uVar3 + 2] = '\0';
    for (uVar4 = 0; uVar4 < uVar7; uVar4 = uVar4 + 1) {
      cVar1 = valueBuf[uVar4];
      valueBuf[uVar4] = valueBuf[uVar7];
      valueBuf[uVar7] = cVar1;
      uVar7 = uVar7 - 1;
    }
  }
  else {
    local_14c = '\0';
LAB_0010aa0a:
    if (uVar8 == 0x58) {
      __format = "%X";
    }
    else if (uVar8 == 0x78) {
      __format = "%x";
    }
    else if (uVar8 == 100) {
      __format = "%d";
    }
    else {
      if (uVar8 == 0x66) {
        if (fmt->hasFrac == true) {
          uVar4 = fmt->fracWidth;
          if (0xff < uVar4) {
            error("Fractional width %zu too long, limiting to 255\n",uVar4);
            uVar4 = 0xff;
          }
        }
        else {
          uVar4 = 5;
        }
        dVar11 = fix_PrecisionFactor();
        snprintf(valueBuf,0x106,"%.*f",(double)value / dVar11,uVar4 & 0xffffffff);
        goto LAB_0010ab30;
      }
      if (uVar8 == 0x75) {
        __format = "%u";
      }
      else {
        if (uVar8 == 0x62) goto LAB_0010aa92;
        __format = "%d";
        if (uVar8 == 0x6f) {
          __format = "%o";
        }
      }
    }
    snprintf(valueBuf,0x106,__format,(ulong)value);
  }
LAB_0010ab30:
  __n = strlen(valueBuf);
  uVar7 = (((ulong)(local_14c != '\0') + 1) - (ulong)(cVar10 == '\0')) + __n;
  uVar4 = fmt->width;
  if (fmt->width <= uVar7) {
    uVar4 = uVar7;
  }
  uVar3 = bufLen - 1;
  if ((uVar3 < uVar4) && (error("Formatted numeric value too long\n"), uVar4 = uVar3, uVar3 < uVar7)
     ) {
    __n = (__n + uVar3) - uVar7;
    uVar7 = uVar3;
  }
  if ((((__n <= uVar7) && (lVar9 = uVar4 - uVar7, uVar7 <= uVar4)) && (uVar7 < bufLen)) &&
     (uVar4 < bufLen)) {
    if (fmt->alignLeft == true) {
      if (cVar10 != '\0') {
        *buf = cVar10;
      }
      uVar7 = (ulong)(cVar10 != '\0');
      if (local_14c != '\0') {
        buf[uVar7] = local_14c;
        uVar7 = uVar7 + 1;
      }
      memcpy(buf + uVar7,valueBuf,__n);
      for (uVar7 = uVar7 + __n; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        buf[uVar7] = ' ';
      }
    }
    else {
      if (fmt->padZero == false) {
        for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
          buf[lVar5] = ' ';
        }
        lVar5 = lVar9;
        if (cVar10 != '\0') {
          buf[lVar9] = cVar10;
          lVar5 = lVar9 + 1;
        }
        if (local_14c != '\0') {
          buf[lVar5] = local_14c;
          lVar5 = lVar5 + 1;
        }
      }
      else {
        if (cVar10 != '\0') {
          *buf = cVar10;
        }
        uVar3 = (ulong)(cVar10 != '\0');
        if (local_14c != '\0') {
          buf[uVar3] = local_14c;
          uVar3 = uVar3 + 1;
        }
        lVar5 = (uVar4 + uVar3) - uVar7;
        for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
          buf[lVar6 + uVar3] = '0';
        }
      }
      memcpy(buf + lVar5,valueBuf,__n);
    }
    buf[uVar4] = '\0';
    return;
  }
  __assert_fail("numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/format.cpp"
                ,0x101,"void fmt_PrintNumber(char *, size_t, const struct FormatSpec *, uint32_t)");
}

Assistant:

void fmt_PrintNumber(char *buf, size_t bufLen, struct FormatSpec const *fmt, uint32_t value)
{
	if (fmt->type != 'X' && fmt->type != 'x' && fmt->type != 'b' && fmt->type != 'o'
	    && fmt->prefix)
		error("Formatting type '%c' with prefix flag '#'\n", fmt->type);
	if (fmt->type != 'f' && fmt->hasFrac)
		error("Formatting type '%c' with fractional width\n", fmt->type);
	if (fmt->type == 's')
		error("Formatting number as type 's'\n");

	char sign = fmt->sign; // 0 or ' ' or '+'

	if (fmt->type == 'd' || fmt->type == 'f') {
		int32_t v = value;

		if (v < 0 && v != INT32_MIN) {
			sign = '-';
			value = -v;
		}
	}

	char prefix = !fmt->prefix ? 0
		: fmt->type == 'X' ? '$'
		: fmt->type == 'x' ? '$'
		: fmt->type == 'b' ? '%'
		: fmt->type == 'o' ? '&'
		: 0;

	char valueBuf[262]; // Max 5 digits + decimal + 255 fraction digits + terminator

	if (fmt->type == 'b') {
		// Special case for binary
		char *ptr = valueBuf;

		do {
			*ptr++ = (value & 1) + '0';
			value >>= 1;
		} while (value);

		*ptr = '\0';

		// Reverse the digits
		size_t valueLen = ptr - valueBuf;

		for (size_t i = 0, j = valueLen - 1; i < j; i++, j--) {
			char c = valueBuf[i];

			valueBuf[i] = valueBuf[j];
			valueBuf[j] = c;
		}
	} else if (fmt->type == 'f') {
		// Special case for fixed-point

		// Default fractional width (C's is 6 for "%f"; here 5 is enough for Q16.16)
		size_t fracWidth = fmt->hasFrac ? fmt->fracWidth : 5;

		if (fracWidth > 255) {
			error("Fractional width %zu too long, limiting to 255\n",
			      fracWidth);
			fracWidth = 255;
		}

		snprintf(valueBuf, sizeof(valueBuf), "%.*f", (int)fracWidth,
			 value / fix_PrecisionFactor());
	} else {
		char const *spec = fmt->type == 'd' ? "%" PRId32
				 : fmt->type == 'u' ? "%" PRIu32
				 : fmt->type == 'X' ? "%" PRIX32
				 : fmt->type == 'x' ? "%" PRIx32
				 : fmt->type == 'o' ? "%" PRIo32
				 : "%" PRId32;

		snprintf(valueBuf, sizeof(valueBuf), spec, value);
	}

	size_t len = strlen(valueBuf);
	size_t numLen = (sign != 0) + (prefix != 0) + len;
	size_t totalLen = fmt->width > numLen ? fmt->width : numLen;

	if (totalLen > bufLen - 1) { // bufLen includes terminator
		error("Formatted numeric value too long\n");
		totalLen = bufLen - 1;
		if (numLen > totalLen) {
			len -= numLen - totalLen;
			numLen = totalLen;
		}
	}
	assert(numLen < bufLen && totalLen < bufLen && numLen <= totalLen && len <= numLen);

	size_t padLen = totalLen - numLen;
	size_t pos = 0;

	if (fmt->alignLeft) {
		if (sign)
			buf[pos++] = sign;
		if (prefix)
			buf[pos++] = prefix;
		memcpy(buf + pos, valueBuf, len);
		for (size_t i = pos + len; i < totalLen; i++)
			buf[i] = ' ';
	} else {
		if (fmt->padZero) {
			// sign, then prefix, then zero padding
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = '0';
		} else {
			// space padding, then sign, then prefix
			for (size_t i = 0; i < padLen; i++)
				buf[pos++] = ' ';
			if (sign)
				buf[pos++] = sign;
			if (prefix)
				buf[pos++] = prefix;
		}
		memcpy(buf + pos, valueBuf, len);
	}

	buf[totalLen] = '\0';
}